

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O1

FSerializer * Serialize<FSwitchDef>(FSerializer *arc,char *key,FSwitchDef **Switch,FSwitchDef **def)

{
  FSwitchDef *pFVar1;
  FTextureID tex;
  FTextureID local_1c;
  
  if (arc->w == (FWriter *)0x0) {
    local_1c.texnum = -1;
    Serialize(arc,key,&local_1c,(FTextureID *)0x0);
    pFVar1 = FTextureManager::FindSwitch(&TexMan,local_1c);
    *Switch = pFVar1;
  }
  else {
    Serialize(arc,key,&(*Switch)->PreTexture,(FTextureID *)0x0);
  }
  return arc;
}

Assistant:

FSerializer &Serialize (FSerializer &arc, const char *key, FSwitchDef* &Switch, FSwitchDef **def)
{
	if (arc.isWriting())
	{
		Serialize(arc, key, Switch->PreTexture, nullptr);
	}
	else
	{
		FTextureID tex;
		tex.SetInvalid();
		Serialize(arc, key, tex, nullptr);
		Switch = TexMan.FindSwitch(tex);
	}
	return arc;
}